

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O2

TemplateString *
ctemplate::TemplateString::IdToString(TemplateString *__return_storage_ptr__,TemplateId id)

{
  char *pcVar1;
  size_t sVar2;
  TemplateId TVar3;
  const_iterator cVar4;
  key_type local_38;
  
  Mutex::ReaderLock((Mutex *)(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::template_string_set !=
      (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    local_38.ptr_ = (char *)0x0;
    local_38.length_ = 0;
    local_38.is_immutable_ = false;
    local_38.id_ = id;
    cVar4 = std::
            _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((anonymous_namespace)::template_string_set,&local_38);
    if (cVar4.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur !=
        (__node_type *)0x0) {
      pcVar1 = *(char **)((long)cVar4.super__Node_iterator_base<ctemplate::TemplateString,_true>.
                                _M_cur + 8);
      sVar2 = *(size_t *)
               ((long)cVar4.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur + 0x10
               );
      TVar3 = *(TemplateId *)
               ((long)cVar4.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur + 0x20
               );
      *(undefined8 *)&__return_storage_ptr__->is_immutable_ =
           *(undefined8 *)
            ((long)cVar4.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur + 0x18);
      __return_storage_ptr__->id_ = TVar3;
      __return_storage_ptr__->ptr_ = pcVar1;
      __return_storage_ptr__->length_ = sVar2;
      goto LAB_00131c91;
    }
  }
  __return_storage_ptr__->ptr_ = kStsEmpty;
  __return_storage_ptr__->length_ = DAT_00154f68;
  __return_storage_ptr__->is_immutable_ = true;
  __return_storage_ptr__->id_ = DAT_00154f70;
LAB_00131c91:
  Mutex::ReaderUnlock((Mutex *)(anonymous_namespace)::mutex);
  return __return_storage_ptr__;
}

Assistant:

LOCKS_EXCLUDED(mutex) {
  ReaderMutexLock reader_lock(&mutex);
  if (!template_string_set)
    return TemplateString(kStsEmpty);
  // To search the set by TemplateId, we must first construct a dummy
  // TemplateString.  This may seem weird, but it lets us use a
  // hash_set instead of a hash_map.
  TemplateString id_as_template_string(NULL, 0, false, id);
  const TemplateString* iter = find_ptr0(*template_string_set, id_as_template_string);
  return iter ? *iter : TemplateString(kStsEmpty);
}